

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::msgpack::basic_msgpack_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>
::basic_msgpack_cursor<std::__cxx11::istringstream&>
          (basic_msgpack_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *this,
          basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *source,
          error_code *ec)

{
  undefined1 local_19;
  undefined8 local_18;
  undefined8 local_10;
  undefined4 local_8;
  
  local_8 = 0x400;
  local_18 = 0x997198;
  local_10 = 0x9971c0;
  basic_msgpack_cursor<std::__cxx11::istringstream&>(this,&local_19,source,&local_18,ec);
  return;
}

Assistant:

basic_msgpack_cursor(Sourceable&& source, std::error_code& ec)
       : basic_msgpack_cursor(std::allocator_arg, Allocator(),
             std::forward<Sourceable>(source), 
             msgpack_decode_options(), 
             ec)
    {
    }